

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_input_begin(nk_context *ctx)

{
  long lVar1;
  
  if (ctx != (nk_context *)0x0) {
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
      *(undefined4 *)((long)(ctx->style).cursors + lVar1 + -0x68) = 0;
    }
    (ctx->input).keyboard.text_len = 0;
    (ctx->input).mouse.scroll_delta.x = 0.0;
    (ctx->input).mouse.scroll_delta.y = 0.0;
    (ctx->input).mouse.prev = (ctx->input).mouse.pos;
    (ctx->input).mouse.delta.x = 0.0;
    (ctx->input).mouse.delta.y = 0.0;
    for (lVar1 = 0; lVar1 != 0x1e; lVar1 = lVar1 + 1) {
      (ctx->input).keyboard.keys[lVar1].clicked = 0;
    }
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x367b,"void nk_input_begin(struct nk_context *)");
}

Assistant:

NK_API void
nk_input_begin(struct nk_context *ctx)
{
    int i;
    struct nk_input *in;
    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;
    for (i = 0; i < NK_BUTTON_MAX; ++i)
        in->mouse.buttons[i].clicked = 0;

    in->keyboard.text_len = 0;
    in->mouse.scroll_delta = nk_vec2(0,0);
    in->mouse.prev.x = in->mouse.pos.x;
    in->mouse.prev.y = in->mouse.pos.y;
    in->mouse.delta.x = 0;
    in->mouse.delta.y = 0;
    for (i = 0; i < NK_KEY_MAX; i++)
        in->keyboard.keys[i].clicked = 0;
}